

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ieee.h
# Opt level: O0

bool __thiscall double_conversion::Double::LowerBoundaryIsCloser(Double *this)

{
  int iVar1;
  uint64_t uVar2;
  Double *in_RDI;
  bool physical_significand_is_zero;
  undefined1 local_a;
  
  uVar2 = AsUint64(in_RDI);
  local_a = false;
  if ((uVar2 & 0xfffffffffffff) == 0) {
    iVar1 = Exponent(in_RDI);
    local_a = iVar1 != -0x432;
  }
  return local_a;
}

Assistant:

bool LowerBoundaryIsCloser() const {
    // The boundary is closer if the significand is of the form f == 2^p-1 then
    // the lower boundary is closer.
    // Think of v = 1000e10 and v- = 9999e9.
    // Then the boundary (== (v - v-)/2) is not just at a distance of 1e9 but
    // at a distance of 1e8.
    // The only exception is for the smallest normal: the largest denormal is
    // at the same distance as its successor.
    // Note: denormals have the same exponent as the smallest normals.
    bool physical_significand_is_zero = ((AsUint64() & kSignificandMask) == 0);
    return physical_significand_is_zero && (Exponent() != kDenormalExponent);
  }